

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

void GD::print_lda_features(vw *all,example *ec)

{
  byte bVar1;
  byte *pbVar2;
  element_type *peVar3;
  _func_void_weight_ptr_void_ptr *p_Var4;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  uint32_t *puVar5;
  ostream *poVar6;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var7;
  weight *pwVar8;
  byte *pbVar9;
  ulong *puVar10;
  features *pfVar11;
  byte *pbVar12;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar13;
  float *pfVar14;
  long lVar15;
  ulong uVar16;
  uint64_t index;
  ulong local_90;
  float *local_88;
  ulong local_80;
  features *local_78;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_70;
  long local_68;
  byte *local_60;
  byte *local_58;
  ulong local_50;
  float *local_48;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  float *local_38;
  
  puVar5 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar5 = &(all->weights).sparse_weights._stride_shift;
  }
  pbVar12 = (ec->super_example_predict).indices._begin;
  pbVar2 = (ec->super_example_predict).indices._end;
  if (pbVar12 != pbVar2) {
    pfVar11 = (ec->super_example_predict).feature_space;
    lVar15 = 0;
    pbVar9 = pbVar12;
    do {
      lVar15 = lVar15 + ((long)(ec->super_example_predict).feature_space[*pbVar9].values._end -
                         (long)pfVar11[*pbVar9].values._begin >> 2);
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar2);
    if (pbVar12 != pbVar2) {
      local_50 = (ulong)*puVar5;
      local_70 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)&(all->weights).sparse_weights;
      local_78 = pfVar11;
      local_68 = lVar15;
      local_60 = pbVar2;
      do {
        bVar1 = *pbVar12;
        pfVar14 = local_78[bVar1].values._begin;
        local_48 = local_78[bVar1].values._end;
        local_58 = pbVar12;
        if (pfVar14 != local_48) {
          puVar10 = local_78[bVar1].indicies._begin;
          psVar13 = local_78[bVar1].space_names._begin;
          do {
            local_90._0_1_ = 9;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)&local_90,1);
            peVar3 = (psVar13->
                     super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(peVar3->first)._M_dataplus._M_p,
                                (peVar3->first)._M_string_length);
            local_90._0_1_ = 0x5e;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_90,1);
            peVar3 = (psVar13->
                     super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            local_40 = psVar13;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(peVar3->second)._M_dataplus._M_p,
                                (peVar3->second)._M_string_length);
            local_90._0_1_ = 0x3a;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_90,1);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            local_90 = CONCAT71(local_90._1_7_,0x3a);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_90,1);
            local_38 = pfVar14;
            std::ostream::_M_insert<double>((double)*pfVar14);
            if (all->lda != 0) {
              uVar16 = 0;
              do {
                local_90 = CONCAT71(local_90._1_7_,0x3a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)&local_90,1);
                if ((all->weights).sparse == true) {
                  local_80 = *puVar10 & (all->weights).sparse_weights._weight_mask;
                  _Var7._M_cur = (__node_type *)
                                 std::
                                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 ::find(local_70,&local_80);
                  if (_Var7._M_cur == (__node_type *)0x0) {
                    local_88 = calloc_or_throw<float>
                                         (1L << ((byte)(all->weights).sparse_weights._stride_shift &
                                                0x3f));
                    this = local_70;
                    local_90 = local_80;
                    std::
                    _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    ::_M_emplace<std::pair<unsigned_long,float*>>
                              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                *)local_70,&local_90);
                    _Var7._M_cur = (__node_type *)
                                   std::
                                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                   ::find(this,&local_80);
                    p_Var4 = (all->weights).sparse_weights.fun;
                    if (p_Var4 != (_func_void_weight_ptr_void_ptr *)0x0) {
                      (*p_Var4)(*(weight **)((long)_Var7._M_cur + 0x10),
                                (all->weights).sparse_weights.default_data);
                    }
                  }
                  pwVar8 = *(weight **)
                            ((long)&((_Var7._M_cur)->
                                    super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                    ._M_storage._M_storage + 8);
                }
                else {
                  pwVar8 = (all->weights).dense_weights._begin +
                           (*puVar10 & (all->weights).dense_weights._weight_mask);
                }
                std::ostream::_M_insert<double>((double)pwVar8[uVar16]);
                uVar16 = uVar16 + 1;
              } while (uVar16 < all->lda);
            }
            pfVar14 = local_38 + 1;
            puVar10 = puVar10 + 1;
            psVar13 = local_40 + 1;
          } while (pfVar14 != local_48);
        }
        pbVar12 = local_58 + 1;
      } while (pbVar12 != local_60);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," total of ",10);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," features.",10);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return;
}

Assistant:

inline void audit_feature(audit_results& dat, const float ft_weight, const uint64_t ft_idx)
{
  parameters& weights = dat.all.weights;
  uint64_t index = ft_idx & weights.mask();
  size_t stride_shift = weights.stride_shift();

  string ns_pre;
  for (string& s : dat.ns_pre) ns_pre += s;

  if (dat.all.audit)
  {
    ostringstream tempstream;
    tempstream << ':' << (index >> stride_shift) << ':' << ft_weight << ':'
               << trunc_weight(weights[index], (float)dat.all.sd->gravity) * (float)dat.all.sd->contraction;

    if (dat.all.adaptive)
      tempstream << '@' << (&weights[index])[1];

    string_value sv = {weights[index] * ft_weight, ns_pre + tempstream.str()};
    dat.results.push_back(sv);
  }

  if ((dat.all.current_pass == 0 || dat.all.training == false) && dat.all.hash_inv)
  {
    // for invert_hash

    if (dat.offset != 0)
    {
      // otherwise --oaa output no features for class > 0.
      ostringstream tempstream;
      tempstream << '[' << (dat.offset >> stride_shift) << ']';
      ns_pre += tempstream.str();
    }

    if (!dat.all.name_index_map.count(ns_pre))
      dat.all.name_index_map.insert(std::map<std::string, size_t>::value_type(ns_pre, index >> stride_shift));
  }
}